

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptError * __thiscall
Js::JavascriptLibrary::CreateExternalError(JavascriptLibrary *this,ErrorTypeEnum errorTypeEnum)

{
  DynamicType *type;
  Recycler *alloc;
  JavascriptError *this_00;
  long lVar1;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  lVar1 = 0xde8;
  if (errorTypeEnum - kjstEvalError < 10) {
    lVar1 = (ulong)(errorTypeEnum - kjstEvalError) * 8 + 0xdf0;
  }
  type = *(DynamicType **)
          ((long)&(this->super_JavascriptLibraryBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar1);
  local_48 = (undefined1  [8])&JavascriptError::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x18aa;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  this_00 = (JavascriptError *)new<Memory::Recycler>(0x40,alloc,0x387914);
  JavascriptError::JavascriptError(this_00,type,1,0);
  JavascriptError::SetErrorType(this_00,errorTypeEnum);
  return this_00;
}

Assistant:

JavascriptError* JavascriptLibrary::CreateExternalError(ErrorTypeEnum errorTypeEnum)
    {
        DynamicType* baseErrorType = NULL;
        switch (errorTypeEnum)
        {
        case kjstError:
        default:
            baseErrorType = errorType;
            break;
        case kjstEvalError:
            baseErrorType = evalErrorType;
            break;
        case kjstRangeError:
            baseErrorType = rangeErrorType;
            break;
        case kjstReferenceError:
            baseErrorType = referenceErrorType;
            break;
        case kjstSyntaxError:
            baseErrorType = syntaxErrorType;
            break;
        case kjstTypeError:
            baseErrorType = typeErrorType;
            break;
        case kjstURIError:
            baseErrorType = uriErrorType;
            break;
        case kjstAggregateError:
            baseErrorType = aggregateErrorType;
            break;
        case kjstWebAssemblyCompileError:
            baseErrorType = webAssemblyCompileErrorType;
            break;
        case kjstWebAssemblyRuntimeError:
            baseErrorType = webAssemblyRuntimeErrorType;
            break;
        case kjstWebAssemblyLinkError:
            baseErrorType = webAssemblyLinkErrorType;
            break;
        }

        JavascriptError *pError = RecyclerNew(recycler, JavascriptError, baseErrorType, TRUE);
        JavascriptError::SetErrorType(pError, errorTypeEnum);
        return pError;
    }